

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_atomic.h
# Opt level: O2

bool density::raw_atomic_compare_exchange_strong
               (uintptr_t *i_atomic,uintptr_t *i_expected,uintptr_t i_desired,memory_order i_success
               ,memory_order i_failure)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  bool bVar3;
  
  detail::mem_order_cnv(i_success);
  detail::mem_order_cnv(i_failure);
  uVar1 = *i_expected;
  LOCK();
  uVar2 = *i_atomic;
  bVar3 = uVar1 == uVar2;
  if (bVar3) {
    *i_atomic = i_desired;
    uVar2 = uVar1;
  }
  UNLOCK();
  if (!bVar3) {
    *i_expected = uVar2;
  }
  return bVar3;
}

Assistant:

inline bool raw_atomic_compare_exchange_strong(
      uintptr_t *       i_atomic,
      uintptr_t *       i_expected,
      uintptr_t         i_desired,
      std::memory_order i_success,
      std::memory_order i_failure) noexcept
    {
        DENSITY_ASSUME_ALIGNED((void *)i_atomic, alignof(decltype(i_atomic)));

        return __atomic_compare_exchange_n(
          i_atomic,
          i_expected,
          i_desired,
          false,
          detail::mem_order_cnv(i_success),
          detail::mem_order_cnv(i_failure));
    }